

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  ModuleID MVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined8 *aValue;
  char16 *pcVar8;
  RecyclableObject *this;
  JavascriptString *pJVar9;
  undefined4 extraout_var;
  JavascriptBoolean *pJVar10;
  Type TVar11;
  ulong uVar12;
  OpCode op;
  char16_t *pcVar13;
  uint uVar14;
  ulong uVar15;
  
  Output::Print(L"    Constant Table:\n    ======== =====\n    ");
  uVar15 = 1;
  uVar3 = FunctionBody::GetCountField(dumpFunction,ConstantCount);
  if (1 < uVar3) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      Output::Print(L" R%d ",uVar15);
      aValue = (undefined8 *)FunctionBody::GetConstantVar(dumpFunction,(RegSlot)uVar15);
      if (aValue == (undefined8 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x8f,"(varConst != nullptr)","varConst != nullptr");
        if (!bVar2) goto LAB_007f80e3;
        *puVar7 = 0;
      }
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_007f80e3;
        *puVar7 = 0;
      }
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        pcVar8 = OpCodeUtil::GetOpCodeName(LdC_A_I4);
        Output::Print(L"%-10s",pcVar8);
        if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_007f80e3;
          *puVar7 = 0;
        }
        uVar12 = (ulong)aValue & 0xffffffff;
LAB_007f7cdb:
        Output::Print(L" int:%d ",uVar12);
        goto LAB_007f7e8b;
      }
      if (aValue == &NullFrameDisplay) {
        op = LdNullDisplay;
        goto LAB_007f7e75;
      }
      if (aValue == &StrictNullFrameDisplay) {
        op = LdStrictNullDisplay;
        goto LAB_007f7e75;
      }
      if (aValue == (undefined8 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_007f80e3;
        *puVar7 = 0;
      }
      TVar11 = TypeIds_Number;
      if (aValue < (undefined8 *)0x4000000000000) {
        this = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) goto LAB_007f80e3;
          *puVar7 = 0;
        }
        TVar11 = ((this->type).ptr)->typeId;
        if ((0x57 < (int)TVar11) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) goto LAB_007f80e3;
          *puVar7 = 0;
        }
      }
      if (0x20 < (int)TVar11) {
        if (TVar11 != TypeIds_ArrayLastWithES5) {
          if (TVar11 != TypeIds_GlobalObject) {
            if (TVar11 == TypeIds_LastTrueJavascriptObjectType) {
              pcVar8 = OpCodeUtil::GetOpCodeName(LdModuleRoot);
              Output::Print(L"%-10s",pcVar8);
              MVar5 = FunctionBody::GetModuleID(dumpFunction);
              uVar12 = (ulong)MVar5;
              goto LAB_007f7cdb;
            }
            goto switchD_007f7e40_caseD_3;
          }
          op = LdRoot;
          goto LAB_007f7e75;
        }
        Output::Print(L"%-10s",L"LdStringTemplate");
        FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
        pcVar8 = JavascriptLibrary::GetStringTemplateCallsiteObjectKey(aValue);
        pcVar13 = L" (\"%s\")";
        goto LAB_007f7e81;
      }
      switch(TVar11) {
      case TypeIds_Undefined:
        pcVar8 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar8);
        pcVar13 = L" (undefined)";
        goto LAB_007f802f;
      case TypeIds_Null:
        pcVar8 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar8);
        pcVar13 = L" (null)";
LAB_007f802f:
        Output::Print(pcVar13);
        break;
      case TypeIds_Boolean:
        pJVar10 = VarTo<Js::JavascriptBoolean>(aValue);
        op = (ushort)(pJVar10->value == 0) * 2 + LdTrue;
        goto LAB_007f7e75;
      default:
switchD_007f7e40_caseD_3:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0xe9,"((0))","Unexpected object type in DumpConstantTable");
        if (!bVar2) {
LAB_007f80e3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
        break;
      case TypeIds_Number:
        pcVar8 = OpCodeUtil::GetOpCodeName(LdC_A_R8);
        Output::Print(L"%-10s",pcVar8);
        if (aValue < (undefined8 *)0x4000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                      ,0xd4,"(Is(aValue))",
                                      "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar2) goto LAB_007f80e3;
          *puVar7 = 0;
        }
        Output::Print(L"%G",(ulong)aValue ^ 0xfffc000000000000);
        break;
      case TypeIds_String:
        pcVar8 = OpCodeUtil::GetOpCodeName(LdStr);
        Output::Print(L"%-10s",pcVar8);
        pJVar9 = VarTo<Js::JavascriptString>(aValue);
        iVar6 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar9);
        bVar2 = VarIs<Js::PropertyString>(aValue);
        pcVar13 = L"";
        if (bVar2) {
          pcVar13 = L" [prop]";
        }
        Output::Print(L" (\"%s\")%s",CONCAT44(extraout_var,iVar6),pcVar13);
        break;
      case TypeIds_BigInt:
        op = BigIntLiteral;
LAB_007f7e75:
        pcVar8 = OpCodeUtil::GetOpCodeName(op);
        pcVar13 = L"%-10s";
LAB_007f7e81:
        Output::Print(pcVar13,pcVar8);
      }
LAB_007f7e8b:
      Output::Print(L"\n    ");
      uVar14 = (RegSlot)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar3 != uVar14);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)
    {
        Output::Print(_u("    Constant Table:\n    ======== =====\n    "));
        uint count = dumpFunction->GetConstantCount();
        for (RegSlot reg = FunctionBody::FirstRegSlot; reg < count; reg++)
        {
            DumpReg(reg);
            Var varConst = dumpFunction->GetConstantVar(reg);
            Assert(varConst != nullptr);
            if (TaggedInt::Is(varConst))
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_I4));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                DumpI4(TaggedInt::ToInt32(varConst));
            }
            else if (varConst == (Js::Var)&Js::NullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (NullDisplay)"));
#endif
            }
            else if (varConst == (Js::Var)&Js::StrictNullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStrictNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (StrictNullDisplay)"));
#endif
            }
            else
            {
                switch (JavascriptOperators::GetTypeId(varConst))
                {
                case Js::TypeIds_Undefined:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (undefined)"));
                    break;
                case Js::TypeIds_Null:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (null)"));
                    break;
                case Js::TypeIds_Boolean:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(
                        VarTo<JavascriptBoolean>(varConst)->GetValue() ? OpCode::LdTrue : OpCode::LdFalse));
                    break;
                case Js::TypeIds_Number:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_R8));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u("%G"), JavascriptNumber::GetValue(varConst));
                    break;
                case Js::TypeIds_BigInt:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::BigIntLiteral));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_String:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStr));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u(" (\"%s\")%s"), VarTo<JavascriptString>(varConst)->GetSz(), Js::VarIs<Js::PropertyString>(varConst) ? _u(" [prop]") : _u(""));
                    break;
                case Js::TypeIds_GlobalObject:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_ModuleRoot:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdModuleRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    DumpI4(dumpFunction->GetModuleID());
                    break;
                case Js::TypeIds_ES5Array:
                    // ES5Array objects in the constant table are always string template callsite objects.
                    // If we later put other ES5Array objects in the constant table, we'll need another way
                    // to decide the constant type.
                    Output::Print(_u("%-10s"), _u("LdStringTemplate"));
                    Output::Print(_u(" (\"%s\")"), dumpFunction->GetScriptContext()->GetLibrary()->GetStringTemplateCallsiteObjectKey(varConst));
                    break;
                default:
                    AssertMsg(UNREACHED, "Unexpected object type in DumpConstantTable");
                    break;
                }
            }
            Output::Print(_u("\n    "));
        }
        Output::Print(_u("\n"));
    }